

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O2

string_t __thiscall
duckdb::TrimOperator<false,true>::Operation<duckdb::string_t,duckdb::string_t>
          (TrimOperator<false,true> *this,string_t input,Vector *result)

{
  utf8proc_category_t uVar1;
  utf8proc_ssize_t uVar2;
  StringVector *len;
  StringVector *extraout_RDX;
  void *__src;
  idx_t next;
  Vector *pVVar3;
  long strlen;
  char *__dest;
  Vector *vector;
  utf8proc_int32_t codepoint;
  string_t target;
  utf8proc_int32_t local_54;
  anon_union_16_2_67f50693_for_value local_50;
  undefined8 local_40;
  void *local_38;
  
  local_38 = input.value._0_8_;
  __src = local_38;
  if ((uint)this < 0xd) {
    __src = (void *)((long)&local_40 + 4);
  }
  pVVar3 = (Vector *)0x0;
  len = input.value._8_8_;
  vector = (Vector *)0x0;
  local_40 = this;
  while (strlen = (long)((ulong)this & 0xffffffff) - (long)pVVar3,
        pVVar3 <= (Vector *)((ulong)this & 0xffffffff) && strlen != 0) {
    uVar2 = utf8proc_iterate((utf8proc_uint8_t *)((long)__src + (long)pVVar3),strlen,&local_54);
    pVVar3 = (Vector *)(&pVVar3->vector_type + uVar2);
    uVar1 = utf8proc_category(local_54);
    len = extraout_RDX;
    if (uVar1 != UTF8PROC_CATEGORY_ZS) {
      vector = pVVar3;
    }
  }
  local_50.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString(input.value._8_8_,vector,(idx_t)len);
  __dest = local_50.pointer.prefix;
  if (0xc < local_50._0_4_) {
    __dest = local_50._8_8_;
  }
  switchD_016b0717::default(__dest,__src,(size_t)vector);
  string_t::Finalize((string_t *)&local_50.pointer);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_50.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		utf8proc_int32_t codepoint;
		auto str = reinterpret_cast<const utf8proc_uint8_t *>(data);

		// Find the first character that is not left trimmed
		idx_t begin = 0;
		if (LTRIM) {
			while (begin < size) {
				auto bytes =
				    utf8proc_iterate(str + begin, UnsafeNumericCast<utf8proc_ssize_t>(size - begin), &codepoint);
				D_ASSERT(bytes > 0);
				if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
					break;
				}
				begin += UnsafeNumericCast<idx_t>(bytes);
			}
		}

		// Find the last character that is not right trimmed
		idx_t end;
		if (RTRIM) {
			end = begin;
			for (auto next = begin; next < size;) {
				auto bytes = utf8proc_iterate(str + next, UnsafeNumericCast<utf8proc_ssize_t>(size - next), &codepoint);
				D_ASSERT(bytes > 0);
				next += UnsafeNumericCast<idx_t>(bytes);
				if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
					end = next;
				}
			}
		} else {
			end = size;
		}

		// Copy the trimmed string
		auto target = StringVector::EmptyString(result, end - begin);
		auto output = target.GetDataWriteable();
		memcpy(output, data + begin, end - begin);

		target.Finalize();
		return target;
	}